

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall
Js::FunctionBody::CheckAndRegisterFuncToDiag(FunctionBody *this,ScriptContext *scriptContext)

{
  ProbeContainer *this_00;
  DWORD_PTR context;
  bool bVar1;
  DebugContext *pDVar2;
  FunctionBody *this_01;
  ArenaAllocator *alloc;
  
  if ((((((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->m_srcInfo
          ).ptr)->sourceContextInfo).ptr)->dwHostSourceContext == 0xffffffffffffffff) &&
     ((this->field_0x178 & 0x10) == 0)) {
    pDVar2 = ScriptContext::GetDebugContext(scriptContext);
    bVar1 = ProbeContainer::IsContextRegistered
                      (pDVar2->diagProbesContainer,
                       ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr
                       )->m_secondaryHostSourceContext);
    if (!bVar1) {
      pDVar2 = ScriptContext::GetDebugContext(scriptContext);
      this_01 = ProbeContainer::GetGlobalFunc
                          (pDVar2->diagProbesContainer,scriptContext,
                           ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo
                           .ptr)->m_secondaryHostSourceContext);
      if (this_01 == (FunctionBody *)0x0) {
        return;
      }
      ParseableFunctionInfo::RegisterFuncToDiag
                (&this_01->super_ParseableFunctionInfo,scriptContext,L"eval code");
      pDVar2 = ScriptContext::GetDebugContext(scriptContext);
      this_00 = pDVar2->diagProbesContainer;
      context = ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
                m_secondaryHostSourceContext;
      alloc = ScriptContext::AllocatorForDiagnostics(scriptContext);
      ProbeContainer::RegisterContextToDiag(this_00,context,alloc);
    }
  }
  this->field_0x178 = this->field_0x178 | 0x10;
  return;
}

Assistant:

void FunctionBody::CheckAndRegisterFuncToDiag(ScriptContext *scriptContext)
    {
        // We will register function if, this is not host managed and it was not registered before.
        if (GetHostSourceContext() == Js::Constants::NoHostSourceContext
            && !m_isFuncRegisteredToDiag
            && !scriptContext->GetDebugContext()->GetProbeContainer()->IsContextRegistered(GetSecondaryHostSourceContext()))
        {
            FunctionBody *pFunc = scriptContext->GetDebugContext()->GetProbeContainer()->GetGlobalFunc(scriptContext, GetSecondaryHostSourceContext());
            if (pFunc)
            {
                // Existing behavior here is to ignore the OOM and since RegisterFuncToDiag
                // can throw now, we simply ignore the OOM here
                try
                {
                    // Register the function to the PDM as eval code (the debugger app will show file as 'eval code')
                    pFunc->RegisterFuncToDiag(scriptContext, Constants::EvalCode);
                }
                catch (Js::OutOfMemoryException)
                {
                }

                scriptContext->GetDebugContext()->GetProbeContainer()->RegisterContextToDiag(GetSecondaryHostSourceContext(), scriptContext->AllocatorForDiagnostics());

                m_isFuncRegisteredToDiag = true;
            }
        }
        else
        {
            m_isFuncRegisteredToDiag = true;
        }

    }